

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O0

void __thiscall
glslang::TParseContextBase::checkIndex
          (TParseContextBase *this,TSourceLoc *loc,TType *type,int *index)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  anon_class_8_1_89923c38 local_30;
  anon_class_8_1_89923c38 sizeIsSpecializationExpression;
  int *index_local;
  TType *type_local;
  TSourceLoc *loc_local;
  TParseContextBase *this_local;
  
  local_30.type = type;
  sizeIsSpecializationExpression.type = (TType *)index;
  if (*index < 0) {
    (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
              (this,loc,"","[","index out of range \'%d\'",(ulong)(uint)*index);
    *(undefined4 *)&(sizeIsSpecializationExpression.type)->_vptr_TType = 0;
  }
  else {
    uVar2 = (*type->_vptr_TType[0x1d])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*type->_vptr_TType[0x1b])();
      if ((uVar2 & 1) == 0) {
        uVar2 = (*type->_vptr_TType[0x1c])();
        if ((uVar2 & 1) == 0) {
          bVar1 = TType::isCoopVecNV(type);
          if ((bVar1) &&
             (iVar4 = *(int *)&(sizeIsSpecializationExpression.type)->_vptr_TType,
             iVar3 = TType::computeNumComponents(type), iVar3 <= iVar4)) {
            (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                      (this,loc,"","[","cooperative vector index out of range \'%d\'",
                       (ulong)*(uint *)&(sizeIsSpecializationExpression.type)->_vptr_TType);
            iVar4 = TType::computeNumComponents(type);
            *(int *)&(sizeIsSpecializationExpression.type)->_vptr_TType = iVar4 + -1;
          }
        }
        else {
          iVar4 = *(int *)&(sizeIsSpecializationExpression.type)->_vptr_TType;
          iVar3 = (*type->_vptr_TType[0xd])();
          if (iVar3 <= iVar4) {
            (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                      (this,loc,"","[","matrix index out of range \'%d\'",
                       (ulong)*(uint *)&(sizeIsSpecializationExpression.type)->_vptr_TType);
            iVar4 = (*type->_vptr_TType[0xd])();
            *(int *)&(sizeIsSpecializationExpression.type)->_vptr_TType = iVar4 + -1;
          }
        }
      }
      else {
        iVar4 = *(int *)&(sizeIsSpecializationExpression.type)->_vptr_TType;
        iVar3 = (*type->_vptr_TType[0xc])();
        if (iVar3 <= iVar4) {
          (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                    (this,loc,"","[","vector index out of range \'%d\'",
                     (ulong)*(uint *)&(sizeIsSpecializationExpression.type)->_vptr_TType);
          iVar4 = (*type->_vptr_TType[0xc])();
          *(int *)&(sizeIsSpecializationExpression.type)->_vptr_TType = iVar4 + -1;
        }
      }
    }
    else {
      uVar2 = (*type->_vptr_TType[0x1e])();
      if ((((uVar2 & 1) != 0) &&
          (bVar1 = checkIndex::anon_class_8_1_89923c38::operator()(&local_30), !bVar1)) &&
         (iVar4 = *(int *)&(sizeIsSpecializationExpression.type)->_vptr_TType,
         iVar3 = (*type->_vptr_TType[0xf])(), iVar3 <= iVar4)) {
        (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                  (this,loc,"","[","array index out of range \'%d\'",
                   (ulong)*(uint *)&(sizeIsSpecializationExpression.type)->_vptr_TType);
        iVar4 = (*type->_vptr_TType[0xf])();
        *(int *)&(sizeIsSpecializationExpression.type)->_vptr_TType = iVar4 + -1;
      }
    }
  }
  return;
}

Assistant:

void TParseContextBase::checkIndex(const TSourceLoc& loc, const TType& type, int& index)
{
    const auto sizeIsSpecializationExpression = [&type]() {
        return type.containsSpecializationSize() &&
               type.getArraySizes()->getOuterNode() != nullptr &&
               type.getArraySizes()->getOuterNode()->getAsSymbolNode() == nullptr; };

    if (index < 0) {
        error(loc, "", "[", "index out of range '%d'", index);
        index = 0;
    } else if (type.isArray()) {
        if (type.isSizedArray() && !sizeIsSpecializationExpression() &&
            index >= type.getOuterArraySize()) {
            error(loc, "", "[", "array index out of range '%d'", index);
            index = type.getOuterArraySize() - 1;
        }
    } else if (type.isVector()) {
        if (index >= type.getVectorSize()) {
            error(loc, "", "[", "vector index out of range '%d'", index);
            index = type.getVectorSize() - 1;
        }
    } else if (type.isMatrix()) {
        if (index >= type.getMatrixCols()) {
            error(loc, "", "[", "matrix index out of range '%d'", index);
            index = type.getMatrixCols() - 1;
        }
    } else if (type.isCoopVecNV()) {
        if (index >= type.computeNumComponents()) {
            error(loc, "", "[", "cooperative vector index out of range '%d'", index);
            index = type.computeNumComponents() - 1;
        }
    }
}